

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadElemSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Index IVar2;
  Result RVar3;
  uint local_6c;
  uint local_68;
  Index func_index;
  Index j;
  uint local_5c;
  Enum local_58;
  Index num_function_indexes;
  Enum local_50;
  Enum local_4c;
  Enum local_48;
  Index local_44;
  char local_3d;
  Index table_index;
  uint uStack_38;
  SegmentFlags flags;
  uint local_34;
  uint32_t flags_u32;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_elem_segments;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_elem_segments = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x7a])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    i = (Index)ReadCount(this,&local_28,"elem segment count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      flags_u32 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x7b])();
      bVar1 = Succeeded((Result)flags_u32);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if ((local_28 == 0) || (IVar2 = NumTotalTables(this), IVar2 != 0)) {
          for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
            table_index = (Index)ReadU32Leb128(this,&stack0xffffffffffffffc8,"elem segment flags");
            bVar1 = Failed((Result)table_index);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (2 < uStack_38) {
              PrintError(this,"invalid elem segment flags");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_3d = (char)uStack_38;
            local_44 = 0;
            if (local_3d == '\x02') {
              local_48 = (Enum)ReadIndex(this,&local_44,"elem segment table index");
              bVar1 = Failed((Result)local_48);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            local_4c = (*this->delegate_->_vptr_BinaryReaderDelegate[0x7c])
                                 (this->delegate_,(ulong)local_34,(ulong)local_44,
                                  (ulong)(local_3d == '\x01'));
            bVar1 = Succeeded((Result)local_4c);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"BeginElemSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (local_3d != '\x01') {
              local_50 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x7d])
                                   (this->delegate_,(ulong)local_34);
              bVar1 = Succeeded((Result)local_50);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                PrintError(this,"BeginElemSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              num_function_indexes = (Index)ReadI32InitExpr(this,local_34);
              bVar1 = Failed((Result)num_function_indexes);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              local_58 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x7e])
                                   (this->delegate_,(ulong)local_34);
              bVar1 = Succeeded((Result)local_58);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                PrintError(this,"EndElemSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            j = (Index)ReadCount(this,&local_5c,"elem segment function index count");
            bVar1 = Failed((Result)j);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            func_index = (*this->delegate_->_vptr_BinaryReaderDelegate[0x7f])
                                   (this->delegate_,(ulong)local_34,(ulong)local_5c);
            bVar1 = Succeeded((Result)func_index);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnElemSegmentFunctionIndexCount callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            for (local_68 = 0; local_68 < local_5c; local_68 = local_68 + 1) {
              RVar3 = ReadIndex(this,&local_6c,"elem segment function index");
              bVar1 = Failed(RVar3);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x80])
                                      (this->delegate_,(ulong)local_34,(ulong)local_6c);
              bVar1 = Succeeded(RVar3);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                PrintError(this,"OnElemSegmentFunctionIndex callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x81])();
            bVar1 = Succeeded(RVar3);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"EndElemSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x82])();
          bVar1 = Succeeded(RVar3);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndElemSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"elem section without table section");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnElemSegmentCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginElemSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadElemSection(Offset section_size) {
  CALLBACK(BeginElemSection, section_size);
  Index num_elem_segments;
  CHECK_RESULT(ReadCount(&num_elem_segments, "elem segment count"));
  CALLBACK(OnElemSegmentCount, num_elem_segments);
  ERROR_UNLESS(num_elem_segments == 0 || NumTotalTables() > 0,
               "elem section without table section");
  for (Index i = 0; i < num_elem_segments; ++i) {
    uint32_t flags_u32;
    CHECK_RESULT(ReadU32Leb128(&flags_u32, "elem segment flags"));
    ERROR_UNLESS(flags_u32 <= static_cast<uint32_t>(SegmentFlags::IndexOther),
                 "invalid elem segment flags");
    SegmentFlags flags = static_cast<SegmentFlags>(flags_u32);
    Index table_index(0);
    if (flags == SegmentFlags::IndexOther) {
      CHECK_RESULT(ReadIndex(&table_index, "elem segment table index"));
    }
    CALLBACK(BeginElemSegment, i, table_index, flags == SegmentFlags::Passive);
    if (flags != SegmentFlags::Passive) {
      CALLBACK(BeginElemSegmentInitExpr, i);
      CHECK_RESULT(ReadI32InitExpr(i));
      CALLBACK(EndElemSegmentInitExpr, i);
    }

    Index num_function_indexes;
    CHECK_RESULT(
        ReadCount(&num_function_indexes, "elem segment function index count"));
    CALLBACK(OnElemSegmentFunctionIndexCount, i, num_function_indexes);
    for (Index j = 0; j < num_function_indexes; ++j) {
      Index func_index;
      CHECK_RESULT(ReadIndex(&func_index, "elem segment function index"));
      CALLBACK(OnElemSegmentFunctionIndex, i, func_index);
    }
    CALLBACK(EndElemSegment, i);
  }
  CALLBACK0(EndElemSection);
  return Result::Ok;
}